

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

void __thiscall Assimp::Ogre::OgreBinarySerializer::ReadMesh(OgreBinarySerializer *this,Mesh *mesh)

{
  bool bVar1;
  bool bVar2;
  Logger *pLVar3;
  basic_formatter *this_00;
  VertexData *this_01;
  uint16_t local_1c6;
  uint16_t id;
  char *local_1b8;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_38;
  Mesh *local_18;
  Mesh *mesh_local;
  OgreBinarySerializer *this_local;
  
  local_18 = mesh;
  mesh_local = (Mesh *)this;
  bVar1 = Read<bool>(this);
  local_18->hasSkeletalAnimations = bVar1;
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,"Reading Mesh");
  pLVar3 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[26]>(&local_1b0,(char (*) [26])"  - Skeletal animations: ");
  local_1b8 = "false";
  if ((local_18->hasSkeletalAnimations & 1U) != 0) {
    local_1b8 = "true";
  }
  this_00 = (basic_formatter *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       &local_1b0,&local_1b8);
  Formatter::basic_formatter::operator_cast_to_string(&local_38,this_00);
  Logger::debug(pLVar3,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_formatter
            (&local_1b0);
  bVar1 = AtEnd(this);
  if (!bVar1) {
    local_1c6 = ReadHeader(this,true);
    while( true ) {
      bVar2 = AtEnd(this);
      bVar1 = false;
      if ((((((!bVar2) && (bVar1 = true, local_1c6 != 0x5000)) &&
            (bVar1 = true, local_1c6 != 0x4000)) &&
           ((bVar1 = true, local_1c6 != 0x6000 && (bVar1 = true, local_1c6 != 0x7000)))) &&
          ((bVar1 = true, local_1c6 != 0x8000 &&
           ((bVar1 = true, local_1c6 != 0x9000 && (bVar1 = true, local_1c6 != 0xa000)))))) &&
         ((bVar1 = true, local_1c6 != 0xb000 &&
          ((bVar1 = true, local_1c6 != 0xc000 && (bVar1 = true, local_1c6 != 0xd000)))))) {
        bVar1 = local_1c6 == 0xe000;
      }
      if (!bVar1) break;
      if (local_1c6 == 0x4000) {
        ReadSubMesh(this,local_18);
      }
      else if (local_1c6 == 0x5000) {
        this_01 = (VertexData *)operator_new(200);
        VertexData::VertexData(this_01);
        local_18->sharedVertexData = this_01;
        ReadGeometry(this,local_18->sharedVertexData);
      }
      else if (local_1c6 == 0x6000) {
        ReadMeshSkeletonLink(this,local_18);
      }
      else if (local_1c6 == 0x7000) {
        ReadBoneAssignment(this,local_18->sharedVertexData);
      }
      else if (local_1c6 == 0x8000) {
        ReadMeshLodInfo(this,local_18);
      }
      else if (local_1c6 == 0x9000) {
        ReadMeshBounds(this,local_18);
      }
      else if (local_1c6 == 0xa000) {
        ReadSubMeshNames(this,local_18);
      }
      else if (local_1c6 == 0xb000) {
        ReadEdgeList(this,local_18);
      }
      else if (local_1c6 == 0xc000) {
        ReadPoses(this,local_18);
      }
      else if (local_1c6 == 0xd000) {
        ReadAnimations(this,local_18);
      }
      else if (local_1c6 == 0xe000) {
        ReadMeshExtremes(this,local_18);
      }
      bVar1 = AtEnd(this);
      if (!bVar1) {
        local_1c6 = ReadHeader(this,true);
      }
    }
    bVar1 = AtEnd(this);
    if (!bVar1) {
      RollbackHeader(this);
    }
  }
  NormalizeBoneWeights(this,local_18->sharedVertexData);
  return;
}

Assistant:

void OgreBinarySerializer::ReadMesh(Mesh *mesh)
{
    mesh->hasSkeletalAnimations = Read<bool>();

    ASSIMP_LOG_DEBUG("Reading Mesh");
    ASSIMP_LOG_DEBUG_F( "  - Skeletal animations: ", mesh->hasSkeletalAnimations ? "true" : "false" );

    if (!AtEnd())
    {
        uint16_t id = ReadHeader();
        while (!AtEnd() &&
            (id == M_GEOMETRY ||
             id == M_SUBMESH ||
             id == M_MESH_SKELETON_LINK ||
             id == M_MESH_BONE_ASSIGNMENT ||
             id == M_MESH_LOD ||
             id == M_MESH_BOUNDS ||
             id == M_SUBMESH_NAME_TABLE ||
             id == M_EDGE_LISTS ||
             id == M_POSES ||
             id == M_ANIMATIONS ||
             id == M_TABLE_EXTREMES))
        {
            switch(id)
            {
                case M_GEOMETRY:
                {
                    mesh->sharedVertexData = new VertexData();
                    ReadGeometry(mesh->sharedVertexData);
                    break;
                }
                case M_SUBMESH:
                {
                    ReadSubMesh(mesh);
                    break;
                }
                case M_MESH_SKELETON_LINK:
                {
                    ReadMeshSkeletonLink(mesh);
                    break;
                }
                case M_MESH_BONE_ASSIGNMENT:
                {
                    ReadBoneAssignment(mesh->sharedVertexData);
                    break;
                }
                case M_MESH_LOD:
                {
                    ReadMeshLodInfo(mesh);
                    break;
                }
                case M_MESH_BOUNDS:
                {
                    ReadMeshBounds(mesh);
                    break;
                }
                case M_SUBMESH_NAME_TABLE:
                {
                    ReadSubMeshNames(mesh);
                    break;
                }
                case M_EDGE_LISTS:
                {
                    ReadEdgeList(mesh);
                    break;
                }
                case M_POSES:
                {
                    ReadPoses(mesh);
                    break;
                }
                case M_ANIMATIONS:
                {
                    ReadAnimations(mesh);
                    break;
                }
                case M_TABLE_EXTREMES:
                {
                    ReadMeshExtremes(mesh);
                    break;
                }
            }

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }

    NormalizeBoneWeights(mesh->sharedVertexData);
}